

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_parser.c
# Opt level: O0

uint8_t * apx_signatureParser_parse_data_element
                    (apx_signatureParser_t *self,uint8_t *begin,uint8_t *end)

{
  apx_signatureParserState_t *paVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  apx_error_t error_code;
  apx_dataElement_t *paVar5;
  uint8_t *puVar6;
  apx_signatureParserState_t *paVar7;
  uint8_t *puVar8;
  uint8_t *local_78;
  uint8_t *local_70;
  apx_signatureParserState_t *parent;
  char local_4e;
  apx_typeCode_t local_4d;
  apx_error_t rc;
  apx_tokenClass_t token_class;
  apx_typeCode_t type_code;
  _Bool check_limits;
  _Bool is_64_bit_type;
  _Bool is_signed_type;
  uint8_t *puStack_48;
  char c;
  uint8_t *result;
  uint8_t *name_end;
  uint8_t *name_begin;
  uint8_t *next;
  uint8_t *end_local;
  uint8_t *begin_local;
  apx_signatureParser_t *self_local;
  
  name_end = (uint8_t *)0x0;
  result = (uint8_t *)0x0;
  if ((self == (apx_signatureParser_t *)0x0) || (self->state == (apx_signatureParserState_t *)0x0))
  {
    __assert_fail("(self != NULL) && (self->state != NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                  ,0xc5,
                  "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                 );
  }
  name_begin = begin;
  if ((self->state->is_record & 1U) != 0) {
    result = bstr_match_pair(begin,end,'\"','\"','\\');
    if (result <= begin) {
      apx_signatureParser_set_error(self,3,begin);
      return (uint8_t *)0x0;
    }
    name_end = begin + 1;
    name_begin = result + 1;
  }
  self_local = (apx_signatureParser_t *)begin;
  if (name_begin < end) {
    bVar4 = true;
    bVar3 = false;
    bVar2 = true;
    local_4d = '\0';
    local_4e = '\x01';
    switch(*name_begin) {
    case '(':
      local_4e = '\x03';
      bVar2 = false;
      break;
    case 'A':
      local_4d = '\n';
      bVar2 = false;
      break;
    case 'B':
      local_4d = '\x0e';
      bVar4 = false;
      break;
    case 'C':
      local_4d = '\x01';
      bVar4 = false;
      break;
    case 'L':
      local_4d = '\x03';
      bVar4 = false;
      break;
    case 'Q':
      local_4d = '\x04';
      bVar4 = false;
      bVar3 = true;
      break;
    case 'S':
      local_4d = '\x02';
      bVar4 = false;
      break;
    case 'T':
      local_4d = '\x10';
      bVar2 = false;
      break;
    case 'U':
      local_4d = '\f';
      bVar2 = false;
      break;
    case '[':
      local_4e = '\x02';
      bVar2 = false;
      break;
    case 'a':
      local_4d = '\t';
      bVar2 = false;
      break;
    case 'b':
      local_4d = '\r';
      bVar2 = false;
      break;
    case 'c':
      local_4d = '\x05';
      break;
    case 'l':
      local_4d = '\a';
      break;
    case 'q':
      local_4d = '\b';
      bVar3 = true;
      break;
    case 's':
      local_4d = '\x06';
      break;
    case 'u':
      local_4d = '\v';
      bVar2 = false;
      break;
    case '{':
      local_4d = '\x0f';
      bVar2 = false;
    }
    if (local_4e == '\x01') {
      if (local_4d == '\0') {
        apx_signatureParser_set_error(self,3,name_begin);
        self_local = (apx_signatureParser_t *)0x0;
      }
      else {
        paVar5 = apx_dataElement_new(local_4d);
        self->state->data_element = paVar5;
        if (self->state->data_element == (apx_dataElement_t *)0x0) {
          apx_signatureParser_set_error(self,2,name_begin);
          self_local = (apx_signatureParser_t *)0x0;
        }
        else {
          puVar6 = name_begin + 1;
          if (name_end != (uint8_t *)0x0) {
            if ((result == (uint8_t *)0x0) || (result < name_end)) {
              __assert_fail("(name_end != NULL) && (name_begin <= name_end)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                            ,0x13b,
                            "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                           );
            }
            error_code = apx_dataElement_set_name_bstr(self->state->data_element,name_end,result);
            if (error_code != 0) {
              apx_signatureParser_set_error(self,error_code,puVar6);
              return (uint8_t *)0x0;
            }
          }
          if (local_4d == '\x10') {
            name_begin = apx_signatureParser_parse_type_reference(self,puVar6,end);
            if (name_begin <= puVar6) {
              apx_signatureParser_set_error(self,3,puVar6);
              return (uint8_t *)0x0;
            }
          }
          else {
            name_begin = puVar6;
            if (local_4d == '\x0f') {
              paVar1 = self->state;
              paVar7 = apx_signatureParserState_new(true);
              self->state = paVar7;
              do {
                if (end <= name_begin) goto LAB_0014d730;
                puVar6 = apx_signatureParser_parse_data_element(self,name_begin,end);
                if (puVar6 <= name_begin) {
                  apx_signatureParser_set_error(self,3,name_begin);
                  apx_signatureParserState_delete(self->state);
                  self->state = paVar1;
                  return (uint8_t *)0x0;
                }
                if (paVar1->data_element == (apx_dataElement_t *)0x0) {
                  __assert_fail("parent->data_element != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                                ,0x15b,
                                "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                               );
                }
                if (self->state->data_element == (apx_dataElement_t *)0x0) {
                  __assert_fail("self->state->data_element != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                                ,0x15c,
                                "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                               );
                }
                apx_dataElement_append_child(paVar1->data_element,self->state->data_element);
                self->state->data_element = (apx_dataElement_t *)0x0;
                if (end <= puVar6) {
                  apx_signatureParser_set_error(self,3,puVar6);
                  apx_signatureParserState_delete(self->state);
                  self->state = paVar1;
                  return (uint8_t *)0x0;
                }
                name_begin = puVar6;
              } while (*puVar6 != '}');
              name_begin = puVar6 + 1;
              apx_signatureParserState_delete(self->state);
              self->state = paVar1;
            }
          }
LAB_0014d730:
          if (bVar2) {
            if (bVar3) {
              if (bVar4) {
                local_70 = apx_signatureParser_parse_limits_i64(self,name_begin,end);
              }
              else {
                local_70 = apx_signatureParser_parse_limits_u64(self,name_begin,end);
              }
              puStack_48 = local_70;
            }
            else {
              if (bVar4) {
                local_78 = apx_signatureParser_parse_limits_i32(self,name_begin,end);
              }
              else {
                local_78 = apx_signatureParser_parse_limits_u32(self,name_begin,end);
              }
              puStack_48 = local_78;
            }
            if (name_begin < puStack_48) {
              name_begin = puStack_48;
            }
            else if (puStack_48 == (uint8_t *)0x0) {
              apx_signatureParser_set_error(self,3,name_begin);
              return (uint8_t *)0x0;
            }
          }
          puVar8 = apx_signatureParser_parse_array(self,name_begin,end);
          puVar6 = puVar8;
          if ((name_begin < puVar8) || (puVar6 = name_begin, puVar8 != (uint8_t *)0x0)) {
            name_begin = puVar6;
            self_local = (apx_signatureParser_t *)name_begin;
          }
          else {
            apx_signatureParser_set_error(self,3,name_begin);
            self_local = (apx_signatureParser_t *)0x0;
          }
        }
      }
    }
    else {
      apx_signatureParser_set_error(self,0xb,name_begin);
      self_local = (apx_signatureParser_t *)0x0;
    }
  }
  return (uint8_t *)self_local;
}

Assistant:

static uint8_t const* apx_signatureParser_parse_data_element(apx_signatureParser_t* self, uint8_t const* begin, uint8_t const* end)
{
   uint8_t const* next = begin;
   uint8_t const* name_begin = NULL;
   uint8_t const* name_end = NULL;
   uint8_t const* result = NULL;
   assert( (self != NULL) && (self->state != NULL) );

   if (self->state->is_record)
   {
      result = bstr_match_pair(next, end, '"', '"', '\\');
      if (result > next)
      {
         name_begin = next + 1; //Don't include first '"' character
         name_end = result;
         next = result + 1; //Move past second '"' character
      }
      else
      {
         apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
         return NULL;
      }
   }
   if (next >= end)
   {
      return begin;
   }
   const char c = *next;
   bool is_signed_type = true;
   bool is_64_bit_type = false;
   bool check_limits = true;
   apx_typeCode_t type_code = APX_TYPE_CODE_NONE;
   apx_tokenClass_t token_class = APX_TOKEN_CLASS_DATA_ELEMENT;
   switch (c)
   {
   case '{':
      type_code = APX_TYPE_CODE_RECORD;
      check_limits = false;
      break;
   case '[':
      token_class = APX_TOKEN_GROUP_DECLARATION;
      check_limits = false;
      break;
   case '(':
      token_class = APX_TOKEN_FUNCTION_DECLARATION;
      check_limits = false;
      break;
   case 'a':
      type_code = APX_TYPE_CODE_CHAR;
      check_limits = false;
      break;
   case 'A':
      type_code = APX_TYPE_CODE_CHAR8;
      check_limits = false;
      break;
   case 'b':
      type_code = APX_TYPE_CODE_BOOL;
      check_limits = false;
      break;
   case 'B':
      type_code = APX_TYPE_CODE_BYTE;
      is_signed_type = false;
      break;
   case 'c':
      type_code = APX_TYPE_CODE_INT8;
      break;
   case 'C':
      type_code = APX_TYPE_CODE_UINT8;
      is_signed_type = false;
      break;
   case 'l':
      type_code = APX_TYPE_CODE_INT32;
      break;
   case 'L':
      type_code = APX_TYPE_CODE_UINT32;
      is_signed_type = false;
      break;
   case 'q':
      type_code = APX_TYPE_CODE_INT64;
      is_64_bit_type = true;
      break;
   case 'Q':
      type_code = APX_TYPE_CODE_UINT64;
      is_signed_type = false;
      is_64_bit_type = true;
      break;
   case 's':
      type_code = APX_TYPE_CODE_INT16;
      break;
   case 'S':
      type_code = APX_TYPE_CODE_UINT16;
      is_signed_type = false;
      break;
   case 'T':
      type_code = APX_TYPE_CODE_REF_ID; //Initial guess, might change while parsing continues
      check_limits = false;
      break;
   case 'u':
      type_code = APX_TYPE_CODE_CHAR16;
      check_limits = false;
      break;
   case 'U':
      type_code = APX_TYPE_CODE_CHAR32;
      check_limits = false;
      break;
   }
   if (token_class == APX_TOKEN_CLASS_DATA_ELEMENT)
   {
      if (type_code == APX_TYPE_CODE_NONE)
      {
         apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
         return NULL;
      }
      else
      {
         self->state->data_element = apx_dataElement_new(type_code);
         if (self->state->data_element == NULL)
         {
            apx_signatureParser_set_error(self, APX_MEM_ERROR, next);
            return NULL;
         }
         next++;
         if (name_begin != NULL)
         {
            assert((name_end != NULL) && (name_begin <= name_end));
            apx_error_t rc = apx_dataElement_set_name_bstr(self->state->data_element, name_begin, name_end);
            if (rc != APX_NO_ERROR)
            {
               apx_signatureParser_set_error(self, rc, next);
               return NULL;
            }
         }
      }
      if (type_code == APX_TYPE_CODE_REF_ID)
      {
         result = apx_signatureParser_parse_type_reference(self, next, end);
         if (result > next)
         {
            next = result;
         }
         else
         {
            apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
            return NULL;
         }
      }
      else if (type_code == APX_TYPE_CODE_RECORD)
      {
         apx_signatureParserState_t* parent = self->state;
         self->state = apx_signatureParserState_new(true);
         while (next < end)
         {
            result = apx_signatureParser_parse_data_element(self, next, end);
            if (result > next)
            {
               next = result;
               assert(parent->data_element != NULL);
               assert(self->state->data_element != NULL);
               apx_dataElement_append_child(parent->data_element, self->state->data_element);
               self->state->data_element = NULL; //Move ownership to parent
            }
            else
            {
               apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
               apx_signatureParserState_delete(self->state);
               self->state = parent;
               return NULL;
            }
            if (next >= end)
            {
               apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
               apx_signatureParserState_delete(self->state);
               self->state = parent;
               return NULL;
            }
            if (*next == '}')
            {
               next++;
               apx_signatureParserState_delete(self->state);
               self->state = parent;
               break;
            }
         }
      }
      if (check_limits)
      {
         if (is_64_bit_type)
         {
            result = is_signed_type ? apx_signatureParser_parse_limits_i64(self, next, end) : apx_signatureParser_parse_limits_u64(self, next, end);
         }
         else
         {
            result = is_signed_type ? apx_signatureParser_parse_limits_i32(self, next, end) : apx_signatureParser_parse_limits_u32(self, next, end);
         }
         if (result > next)
         {
            next = result;
         }
         else if (result == NULL)
         {
            apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
            return NULL;
         }
      }
      result = apx_signatureParser_parse_array(self, next, end);
      if (result > next)
      {
         next = result;
      }
      else if (result == NULL)
      {
         apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
         return NULL;
      }
   }
   else
   {
      apx_signatureParser_set_error(self, APX_NOT_IMPLEMENTED_ERROR, next);
      return NULL;
   }
   return next;
}